

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threewisehash.h
# Opt level: O3

void __thiscall
ThreeWiseHash<unsigned_int,_unsigned_char>::update
          (ThreeWiseHash<unsigned_int,_unsigned_char> *this,uchar param_1,uchar inchar)

{
  iterator *piVar1;
  uchar *puVar2;
  uchar local_11;
  
  puVar2 = (this->ngram).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (puVar2 == (this->ngram).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<unsigned_char,std::allocator<unsigned_char>>::_M_push_back_aux<unsigned_char_const&>
              ((deque<unsigned_char,std::allocator<unsigned_char>> *)&this->ngram,&local_11);
  }
  else {
    *puVar2 = inchar;
    piVar1 = &(this->ngram).super__Deque_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
              .super__Deque_impl_data._M_finish;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  std::deque<unsigned_char,_std::allocator<unsigned_char>_>::pop_front(&this->ngram);
  __updateHashValue(this);
  return;
}

Assistant:

void update(chartype, chartype inchar) {
    ngram.push_back(inchar);
    ngram.pop_front();
    __updateHashValue();
  }